

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O0

bool __thiscall
pybind11::detail::type_caster_generic::try_implicit_casts
          (type_caster_generic *this,handle src,bool convert)

{
  bool bVar1;
  vector<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>
  *this_00;
  void *pvVar2;
  undefined1 local_60 [8];
  type_caster_generic sub_caster;
  pair<const_std::type_info_*,_void_*(*)(void_*)> *cast;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>
  *__range2;
  bool convert_local;
  type_caster_generic *this_local;
  handle src_local;
  
  this_00 = &this->typeinfo->implicit_casts;
  __end2 = std::
           vector<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>
           ::begin(this_00);
  cast = (pair<const_std::type_info_*,_void_*(*)(void_*)> *)
         std::
         vector<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>
         ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::pair<const_std::type_info_*,_void_*(*)(void_*)>_*,_std::vector<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>_>
                                *)&cast);
    if (!bVar1) {
      return false;
    }
    sub_caster.value =
         __gnu_cxx::
         __normal_iterator<const_std::pair<const_std::type_info_*,_void_*(*)(void_*)>_*,_std::vector<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>_>
         ::operator*(&__end2);
    type_caster_generic((type_caster_generic *)local_60,((reference)sub_caster.value)->first);
    bVar1 = load((type_caster_generic *)local_60,src,convert);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_std::pair<const_std::type_info_*,_void_*(*)(void_*)>_*,_std::vector<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>_>
    ::operator++(&__end2);
  }
  pvVar2 = (void *)(**(code **)((long)sub_caster.value + 8))(sub_caster.cpptype);
  this->value = pvVar2;
  return true;
}

Assistant:

bool try_implicit_casts(handle src, bool convert) {
        for (auto &cast : typeinfo->implicit_casts) {
            type_caster_generic sub_caster(*cast.first);
            if (sub_caster.load(src, convert)) {
                value = cast.second(sub_caster.value);
                return true;
            }
        }
        return false;
    }